

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v7::detail::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  int *this;
  long lVar1;
  uint *puVar2;
  undefined8 uVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bigint *lhs2;
  ulong uVar10;
  long lVar11;
  uint64_t value;
  bool bVar12;
  bool bVar13;
  undefined1 local_320 [8];
  bigint denominator;
  bigint upper_store;
  bigint lower;
  bigint numerator;
  bigint *local_38;
  
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  lower._168_8_ = &PTR_grow_002b3c38;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&numerator.bigits_.super_buffer<unsigned_int>.capacity_;
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  numerator.bigits_._160_4_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  local_320 = (undefined1  [8])&PTR_grow_002b3c38;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&denominator.bigits_.super_buffer<unsigned_int>.capacity_;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  denominator.bigits_._160_4_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  upper_store._168_8_ = &PTR_grow_002b3c38;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&lower.bigits_.super_buffer<unsigned_int>.capacity_;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  lower.bigits_._160_4_ = 0;
  local_38 = (bigint *)&denominator.exp_;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  denominator._168_8_ = &PTR_grow_002b3c38;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&upper_store.bigits_.super_buffer<unsigned_int>.capacity_;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  upper_store.bigits_._160_4_ = 0;
  uVar8 = (ulong)d & 0xfffffffffffff;
  uVar5 = (uint)((ulong)d >> 0x34) & 0x7ff;
  uVar10 = uVar8 + 0x10000000000000;
  if (uVar5 == 0) {
    uVar10 = uVar8;
  }
  iVar7 = -0x432;
  if (uVar5 != 0) {
    iVar7 = uVar5 - 0x433;
  }
  bVar13 = uVar8 == 0;
  bVar12 = 1 < uVar5;
  iVar9 = (bVar12 && bVar13) + 1;
  value = uVar10 << (sbyte)iVar9;
  numerator._168_8_ = buf;
  if (iVar7 < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10((bigint *)&lower.exp_,-*exp10);
      puVar2 = numerator.bigits_.super_buffer<unsigned_int>.ptr_;
      if (lower.bigits_.super_buffer<unsigned_int>.size_ <
          numerator.bigits_.super_buffer<unsigned_int>.ptr_) {
        (**(code **)upper_store._168_8_)
                  (&upper_store.exp_,numerator.bigits_.super_buffer<unsigned_int>.ptr_);
      }
      lower.bigits_.super_buffer<unsigned_int>.ptr_ =
           (uint *)lower.bigits_.super_buffer<unsigned_int>.size_;
      if (puVar2 <= lower.bigits_.super_buffer<unsigned_int>.size_) {
        lower.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
      }
      if (puVar2 != (uint *)0x0) {
        memmove(lower.bigits_.super_buffer<unsigned_int>._vptr_buffer,
                numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer,(long)puVar2 << 2);
      }
      puVar2 = numerator.bigits_.super_buffer<unsigned_int>.ptr_;
      lower.bigits_._160_4_ = numerator.bigits_._160_4_;
      if (bVar12 && bVar13) {
        if (upper_store.bigits_.super_buffer<unsigned_int>.size_ <
            numerator.bigits_.super_buffer<unsigned_int>.ptr_) {
          (**(code **)denominator._168_8_)
                    (&denominator.exp_,numerator.bigits_.super_buffer<unsigned_int>.ptr_);
        }
        upper_store.bigits_.super_buffer<unsigned_int>.ptr_ =
             (uint *)upper_store.bigits_.super_buffer<unsigned_int>.size_;
        if (puVar2 <= upper_store.bigits_.super_buffer<unsigned_int>.size_) {
          upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
        }
        if (puVar2 != (uint *)0x0) {
          memmove(upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer,
                  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer,(long)puVar2 << 2);
        }
        local_38 = (bigint *)&denominator.exp_;
        upper_store.bigits_._160_4_ = numerator.bigits_._160_4_;
        bigint::operator<<=(local_38,1);
      }
      else {
        local_38 = (bigint *)0x0;
      }
      bigint::operator*=((bigint *)&lower.exp_,value);
      bigint::assign((bigint *)local_320,1);
      bigint::operator<<=((bigint *)local_320,iVar9 - iVar7);
    }
    else {
      bigint::assign((bigint *)&lower.exp_,value);
      bigint::assign_pow10((bigint *)local_320,*exp10);
      bigint::operator<<=((bigint *)local_320,iVar9 - iVar7);
      bigint::assign((bigint *)&upper_store.exp_,1);
      if (bVar12 && bVar13) {
        bigint::assign((bigint *)&denominator.exp_,2);
      }
      else {
        local_38 = (bigint *)0x0;
      }
    }
  }
  else {
    bigint::assign((bigint *)&lower.exp_,value);
    bigint::operator<<=((bigint *)&lower.exp_,iVar7);
    bigint::assign((bigint *)&upper_store.exp_,1);
    bigint::operator<<=((bigint *)&upper_store.exp_,iVar7);
    if (bVar12 && bVar13) {
      local_38 = (bigint *)&denominator.exp_;
      bigint::assign(local_38,1);
      bigint::operator<<=((bigint *)&denominator.exp_,iVar7 + 1);
    }
    else {
      local_38 = (bigint *)0x0;
    }
    bigint::assign_pow10((bigint *)local_320,*exp10);
    bigint::operator<<=((bigint *)local_320,1);
  }
  lhs2 = local_38;
  if (local_38 == (bigint *)0x0) {
    lhs2 = (bigint *)&upper_store.exp_;
  }
  lVar1 = *(long *)(numerator._168_8_ + 8);
  uVar5 = ~(uint)uVar10 & 1;
  lVar11 = 0;
  this = &lower.exp_;
  while( true ) {
    uVar6 = bigint::divmod_assign((bigint *)this,(bigint *)local_320);
    iVar7 = compare((bigint *)this,(bigint *)&upper_store.exp_);
    iVar9 = add_compare((bigint *)this,lhs2,(bigint *)local_320);
    *(char *)(lVar1 + lVar11) = (char)uVar6 + '0';
    if ((iVar7 < (int)uVar5) || ((int)-uVar5 < iVar9)) break;
    bigint::multiply((bigint *)this,10);
    bigint::multiply((bigint *)&upper_store.exp_,10);
    if (local_38 != (bigint *)0x0) {
      bigint::multiply(lhs2,10);
    }
    lVar11 = lVar11 + 1;
  }
  if (iVar7 < (int)uVar5) {
    if (iVar9 <= (int)-uVar5) goto LAB_0022d9e3;
    iVar7 = add_compare((bigint *)&lower.exp_,(bigint *)&lower.exp_,(bigint *)local_320);
    if ((iVar7 < 1) && ((uVar6 & 1) == 0 || iVar7 != 0)) goto LAB_0022d9e3;
    cVar4 = *(char *)(lVar1 + lVar11) + '\x01';
  }
  else {
    cVar4 = (char)uVar6 + '1';
  }
  *(char *)(lVar1 + lVar11) = cVar4;
LAB_0022d9e3:
  uVar3 = numerator._168_8_;
  uVar10 = lVar11 + 1U & 0xffffffff;
  if (*(ulong *)(numerator._168_8_ + 0x18) < uVar10) {
    (*(code *)**(undefined8 **)numerator._168_8_)(numerator._168_8_,uVar10);
  }
  uVar8 = *(ulong *)(uVar3 + 0x18);
  if (uVar8 < uVar10) {
    uVar10 = uVar8;
  }
  *(ulong *)(uVar3 + 0x10) = uVar10;
  *exp10 = *exp10 - (int)lVar11;
  bigint::~bigint((bigint *)&denominator.exp_);
  bigint::~bigint((bigint *)&upper_store.exp_);
  bigint::~bigint((bigint *)local_320);
  bigint::~bigint((bigint *)&lower.exp_);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.try_resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}